

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

ostream * operator<<(ostream *os,PlayerState state)

{
  long lVar1;
  char *pcVar2;
  
  switch(state) {
  case ATTACKING:
    pcVar2 = "Attacking";
    goto LAB_0010c474;
  case DEFENDING:
    pcVar2 = "Defending";
LAB_0010c474:
    lVar1 = 9;
    break;
  case FORTIFYING:
    pcVar2 = "Fortifying";
    lVar1 = 10;
    break;
  case REINFORCING:
    pcVar2 = "Reinforcing";
    lVar1 = 0xb;
    break;
  case IDLE:
    pcVar2 = "Idle";
    lVar1 = 4;
    break;
  default:
    goto switchD_0010c438_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_0010c438_default:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const PlayerState state) {
    switch (state) {
        case ATTACKING:
            os << "Attacking";
            break;
        case DEFENDING:
            os << "Defending";
            break;
        case FORTIFYING:
            os << "Fortifying";
            break;
        case REINFORCING:
            os << "Reinforcing";
            break;
        case IDLE:
            os << "Idle";
            break;
    }
    return os;
}